

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.h
# Opt level: O0

void __thiscall clean_up_fixture::~clean_up_fixture(clean_up_fixture *this)

{
  bool bVar1;
  clean_up_fixture *this_local;
  
  bVar1 = exists(this);
  if (bVar1) {
    boost::filesystem::remove_all(&this->m_path);
  }
  boost::filesystem::path::~path(&this->m_path);
  return;
}

Assistant:

~clean_up_fixture()
    {
        if(exists())
        {
            try
            {
                fs::remove_all(m_path);
            }
            catch (...) {
            }
        }
    }